

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.h
# Opt level: O0

int get_filter_tap(InterpFilterParams *filter_params,int subpel_qn)

{
  int16_t *piVar1;
  uint in_ESI;
  InterpFilterParams *in_RDI;
  int16_t *filter;
  int local_4;
  
  piVar1 = av1_get_interp_filter_subpel_kernel(in_RDI,in_ESI & 0xf);
  if (in_RDI->taps == 0xc) {
    local_4 = 0xc;
  }
  else if (*piVar1 == 0 && piVar1[7] == 0) {
    if (piVar1[1] == 0 && piVar1[6] == 0) {
      if (piVar1[2] == 0 && piVar1[5] == 0) {
        local_4 = 2;
      }
      else {
        local_4 = 4;
      }
    }
    else {
      local_4 = 6;
    }
  }
  else {
    local_4 = 8;
  }
  return local_4;
}

Assistant:

static inline int get_filter_tap(const InterpFilterParams *const filter_params,
                                 int subpel_qn) {
  const int16_t *const filter = av1_get_interp_filter_subpel_kernel(
      filter_params, subpel_qn & SUBPEL_MASK);
  if (filter_params->taps == 12) {
    return 12;
  }
  if (filter[0] | filter[7]) {
    return 8;
  }
  if (filter[1] | filter[6]) {
    return 6;
  }
#if CONFIG_SVT_AV1
  if (filter[2] | filter[5]) {
    return 4;
  }
  return 2;
#else
  return 4;
#endif
}